

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O3

Expr xor(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
        int argc)

{
  _Bool _Var1;
  long lVar2;
  int iVar3;
  long lVar4;
  Expr EVar5;
  Expr EVar6;
  Expr expr;
  
  if (argc < 1) {
    lVar2 = 0x70;
    lVar4 = 0x68;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      EVar5._4_4_ = 0;
      EVar5.type = *(uint *)((long)&args->type + lVar4);
      EVar5.field_1.val_atom =
           ((anon_union_8_8_707b72ea_for_Expr_1 *)((long)&args->field_1 + lVar4))->val_atom;
      EVar5 = exec_eval(exec,callContext,EVar5);
      expr.field_1 = EVar5.field_1;
      expr._4_4_ = 0;
      expr.type = EVar5.type;
      _Var1 = is_true(exec,expr);
      iVar3 = iVar3 + (uint)_Var1;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)argc << 4 != lVar4);
    lVar2 = (ulong)(iVar3 == 1) * 0x10;
    lVar4 = lVar2 + 0x68;
    lVar2 = lVar2 + 0x70;
  }
  EVar6._4_4_ = 0;
  EVar6.type = *(uint *)((long)&exec->gc_index + lVar4);
  EVar6.field_1.val_atom =
       ((anon_union_8_8_707b72ea_for_Expr_1 *)((long)&exec->gc_index + lVar2))->val_atom;
  return EVar6;
}

Assistant:

BUILTIN_FUNC(xor)
{
    int cnt = 0;
    for (int i = 0; i < argc; i++)
    {
        Expr val = exec_eval(exec, callContext, args[i]);
        if (is_true(exec, val))
            cnt++;
    }
    if (cnt == 1)
        return exec->t;
    else
        return exec->nil;

}